

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_BuildAgain_Test::
~FileDescriptorTest_BuildAgain_Test(FileDescriptorTest_BuildAgain_Test *this)

{
  FileDescriptorTest_BuildAgain_Test *this_local;
  
  ~FileDescriptorTest_BuildAgain_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, BuildAgain) {
  // Test that if we call BuildFile again on the same input we get the same
  // FileDescriptor back.
  FileDescriptorProto file;
  foo_file_->CopyTo(&file);
  EXPECT_EQ(foo_file_, pool_.BuildFile(file));

  // But if we change the file then it won't work.
  file.set_package("some.other.package");
  EXPECT_TRUE(pool_.BuildFile(file) == nullptr);
}